

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_phsubsw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  
  uVar1 = d->_w_MMXReg[0];
  uVar2 = d->_w_MMXReg[2];
  uVar4 = d->_w_MMXReg[3];
  uVar3 = uVar2 - uVar4;
  if (SBORROW2(uVar2,uVar4)) {
    uVar3 = (-1 < (short)(uVar2 - uVar4)) + 0x7fff;
  }
  uVar2 = d->_w_MMXReg[1];
  uVar4 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar4 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[0] = uVar4;
  d->_w_MMXReg[1] = uVar3;
  uVar1 = s->_w_MMXReg[0];
  uVar2 = s->_w_MMXReg[1];
  uVar4 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar4 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[2] = uVar4;
  uVar1 = s->_w_MMXReg[2];
  uVar2 = s->_w_MMXReg[3];
  uVar4 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar4 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[3] = uVar4;
  return;
}

Assistant:

void glue(helper_phsubsw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    d->W(0) = satsw((int16_t)d->W(0) - (int16_t)d->W(1));
    d->W(1) = satsw((int16_t)d->W(2) - (int16_t)d->W(3));
    XMM_ONLY(d->W(2) = satsw((int16_t)d->W(4) - (int16_t)d->W(5)));
    XMM_ONLY(d->W(3) = satsw((int16_t)d->W(6) - (int16_t)d->W(7)));
    d->W((2 << SHIFT) + 0) = satsw((int16_t)s->W(0) - (int16_t)s->W(1));
    d->W((2 << SHIFT) + 1) = satsw((int16_t)s->W(2) - (int16_t)s->W(3));
    XMM_ONLY(d->W(6) = satsw((int16_t)s->W(4) - (int16_t)s->W(5)));
    XMM_ONLY(d->W(7) = satsw((int16_t)s->W(6) - (int16_t)s->W(7)));
}